

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

Struct * __thiscall wasm::HeapType::getStruct(HeapType *this)

{
  bool bVar1;
  HeapTypeInfo *pHVar2;
  HeapType *this_local;
  
  bVar1 = isStruct(this);
  if (!bVar1) {
    __assert_fail("isStruct()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                  ,0x39f,"const Struct &wasm::HeapType::getStruct() const");
  }
  pHVar2 = anon_unknown_0::getHeapTypeInfo((HeapType)this->id);
  return (Struct *)&pHVar2->field_9;
}

Assistant:

const Struct& HeapType::getStruct() const {
  assert(isStruct());
  return getHeapTypeInfo(*this)->struct_;
}